

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::NewKey
          (TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this,
          FMD5Holder key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  hash_t hVar8;
  uint uVar9;
  uint uVar10;
  
  pNVar5 = this->Nodes;
  hVar8 = this->Size;
  do {
    uVar10 = hVar8 - 1 & key.Hash;
    pNVar1 = pNVar5 + uVar10;
    pNVar4 = pNVar1->Next;
    if (pNVar4 == (Node *)0x1) {
LAB_0035f051:
      pNVar7 = (Node *)0x0;
      pNVar5 = pNVar1;
LAB_0035f056:
      pNVar1->Next = pNVar7;
      this->NumUsed = this->NumUsed + 1;
      *(long *)&(pNVar5->Pair).Key = key._0_8_;
      *(long *)((long)&(pNVar5->Pair).Key + 8) = key._8_8_;
      return pNVar5;
    }
    pNVar7 = this->LastFree;
    while (pNVar6 = pNVar7, pNVar7 = pNVar6 + -1, pNVar5 < pNVar6) {
      if (pNVar7->Next == (Node *)0x1) {
        this->LastFree = pNVar7;
        uVar9 = hVar8 - 1 & (pNVar1->Pair).Key.DWords[0];
        if (uVar9 != uVar10) {
          pNVar5 = pNVar5 + uVar9;
          do {
            pNVar4 = pNVar5;
            pNVar5 = pNVar4->Next;
          } while (pNVar5 != pNVar1);
          pNVar4->Next = pNVar7;
          *(undefined8 *)(pNVar6[-1].Pair.Value.CompatFlags + 2) =
               *(undefined8 *)((pNVar1->Pair).Value.CompatFlags + 2);
          pNVar5 = pNVar1->Next;
          uVar2 = *(undefined8 *)&(pNVar1->Pair).Key;
          uVar3 = *(undefined8 *)(pNVar1->Pair).Value.CompatFlags;
          *(undefined8 *)((long)&pNVar6[-1].Pair.Key + 8) =
               *(undefined8 *)((long)&(pNVar1->Pair).Key + 8);
          *(undefined8 *)pNVar6[-1].Pair.Value.CompatFlags = uVar3;
          pNVar7->Next = pNVar5;
          *(undefined8 *)&pNVar6[-1].Pair.Key = uVar2;
          goto LAB_0035f051;
        }
        pNVar7->Next = pNVar4;
        pNVar5 = pNVar7;
        goto LAB_0035f056;
      }
    }
    this->LastFree = pNVar7;
    Resize(this,hVar8 * 2);
    pNVar5 = this->Nodes;
    hVar8 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}